

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Utf8CharLen(char *zIn,int nByte)

{
  int iVar1;
  char *pcVar2;
  byte bVar3;
  u8 *z;
  
  pcVar2 = (char *)0xffffffffffffffff;
  if (-1 < nByte) {
    pcVar2 = zIn + (uint)nByte;
  }
  bVar3 = *zIn;
  iVar1 = 0;
  if (zIn < pcVar2 && bVar3 != 0) {
    iVar1 = 0;
    do {
      if (bVar3 < 0xc0) {
        bVar3 = zIn[1];
      }
      else {
        bVar3 = zIn[1];
      }
      zIn = zIn + 1;
      iVar1 = iVar1 + 1;
    } while ((bVar3 != 0) && (zIn < pcVar2));
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Utf8CharLen(const char *zIn, int nByte){
  int r = 0;
  const u8 *z = (const u8*)zIn;
  const u8 *zTerm;
  if( nByte>=0 ){
    zTerm = &z[nByte];
  }else{
    zTerm = (const u8*)(-1);
  }
  assert( z<=zTerm );
  while( *z!=0 && z<zTerm ){
    SQLITE_SKIP_UTF8(z);
    r++;
  }
  return r;
}